

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

Message * __thiscall
google::protobuf::Reflection::GetDefaultMessageInstance(Reflection *this,FieldDescriptor *field)

{
  MessageFactory *pMVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  MessageFactory *pMVar5;
  Descriptor *pDVar6;
  undefined4 extraout_var;
  Message *pMVar7;
  long *plVar8;
  undefined4 extraout_var_00;
  
  pMVar1 = this->message_factory_;
  pMVar5 = MessageFactory::generated_factory();
  if (pMVar1 == pMVar5) {
    pMVar7 = *(Message **)(field + 0x40);
    if (pMVar7 == (Message *)0x0) {
      pMVar1 = this->message_factory_;
      pDVar6 = FieldDescriptor::message_type(field);
      iVar4 = (*pMVar1->_vptr_MessageFactory[2])(pMVar1,pDVar6);
      pMVar7 = (Message *)CONCAT44(extraout_var_00,iVar4);
      *(Message **)(field + 0x40) = pMVar7;
    }
    return pMVar7;
  }
  if (((((((byte)field[1] & 8) == 0) && (*(char *)(*(long *)(field + 0x38) + 0x4f) == '\0')) &&
       (*(char *)(*(long *)(field + 0x38) + 0x4d) == '\0')) &&
      (bVar3 = IsEagerlyVerifiedLazyField(this,field), !bVar3)) &&
     ((lVar2 = *(long *)(field + 0x28), lVar2 == 0 || ((byte)field[1] & 0x10) == 0 ||
      ((*(int *)(lVar2 + 4) == 1 && ((*(byte *)(*(long *)(lVar2 + 0x20) + 1) & 2) != 0)))))) {
    plVar8 = (long *)internal::ReflectionSchema::GetFieldDefault(&this->schema_,field);
    if ((Message *)*plVar8 != (Message *)0x0) {
      return (Message *)*plVar8;
    }
  }
  pMVar1 = this->message_factory_;
  pDVar6 = FieldDescriptor::message_type(field);
  iVar4 = (*pMVar1->_vptr_MessageFactory[2])(pMVar1,pDVar6);
  return (Message *)CONCAT44(extraout_var,iVar4);
}

Assistant:

const Message* Reflection::GetDefaultMessageInstance(
    const FieldDescriptor* field) const {
  // If we are using the generated factory, we cache the prototype in the field
  // descriptor for faster access.
  // The default instances of generated messages are not cross-linked, which
  // means they contain null pointers on their message fields and can't be used
  // to get the default of submessages.
  if (message_factory_ == MessageFactory::generated_factory()) {
    auto& ptr = field->default_generated_instance_;
    auto* res = ptr.load(std::memory_order_acquire);
    if (res == nullptr) {
      // First time asking for this field's default. Load it and cache it.
      res = message_factory_->GetPrototype(field->message_type());
      ptr.store(res, std::memory_order_release);
    }
    return res;
  }

  // For other factories, we try the default's object field.
  // In particular, the DynamicMessageFactory will cross link the default
  // instances to allow for this. But only do this for real fields.
  // This is an optimization to avoid going to GetPrototype() below, as that
  // requires a lock and a map lookup.
  if (!field->is_extension() && !field->options().weak() &&
      !IsLazyField(field) && !schema_.InRealOneof(field)) {
    auto* res = DefaultRaw<const Message*>(field);
    if (res != nullptr) {
      return res;
    }
  }
  // Otherwise, just go to the factory.
  return message_factory_->GetPrototype(field->message_type());
}